

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_message(lys_module *module,lys_restr *save,char *value,char *what,int message)

{
  int local_30;
  int ret;
  int message_local;
  char *what_local;
  char *value_local;
  lys_restr *save_local;
  lys_module *module_local;
  
  if (message == 0x120) {
    local_30 = yang_check_string(module,&save->eapptag,"error_app_tag",what,value,(lys_node *)0x0);
  }
  else {
    local_30 = yang_check_string(module,&save->emsg,"error_message",what,value,(lys_node *)0x0);
  }
  return local_30;
}

Assistant:

int
yang_read_message(struct lys_module *module,struct lys_restr *save,char *value, char *what, int message)
{
    int ret;

    if (message == ERROR_APP_TAG_KEYWORD) {
        ret = yang_check_string(module, &save->eapptag, "error_app_tag", what, value, NULL);
    } else {
        ret = yang_check_string(module, &save->emsg, "error_message", what, value, NULL);
    }
    return ret;
}